

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::okFromCSC
          (HPresolve *this,vector<double,_std::allocator<double>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart)

{
  bool bVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator __position;
  double *pdVar2;
  int *piVar3;
  int *implVarUpperSource;
  HighsLinearSumBounds *this_00;
  double *varUpper;
  double *implVarLower;
  double *implVarUpper;
  vector<double,_std::allocator<double>_> *__x;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_01;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_02;
  reference pvVar7;
  reference pvVar8;
  vector<int,_std::allocator<int>_> *in_RCX;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  vector<double,_std::allocator<double>_> *in_RSI;
  HPresolve *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar9;
  HighsInt i_1;
  bad_alloc *e;
  HighsInt pos;
  HighsInt collen;
  HighsInt i;
  HighsInt nnz;
  HighsInt ncol;
  undefined8 in_stack_fffffffffffffe78;
  HighsInt numSums;
  HighsLinearSumBounds *in_stack_fffffffffffffe80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffe88
  ;
  undefined8 in_stack_fffffffffffffe90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  *__args;
  value_type_conflict2 *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  value_type vVar10;
  vector<int,_std::allocator<int>_> *this_03;
  const_iterator in_stack_fffffffffffffeb8;
  HighsLinearSumBounds *this_04;
  int local_b4;
  uint local_8c;
  int local_34;
  bool local_1;
  
  numSums = (HighsInt)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x6eb1d0);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6eb1e1);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6eb1f2);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6eb206);
  bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                        (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                        (int)in_stack_fffffffffffffe90);
  if (bVar1) {
    bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                          (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                          (int)in_stack_fffffffffffffe90);
    if (bVar1) {
      bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                            (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffe90);
      if (bVar1) {
        bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                              (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                              (int)in_stack_fffffffffffffe90);
        if (bVar1) {
          bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                                (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                (int)in_stack_fffffffffffffe90);
          if (bVar1) {
            bVar1 = okAssign<int>(in_stack_fffffffffffffe98,
                                  (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                  (int)in_stack_fffffffffffffe90);
            if (bVar1) {
              HighsLinearSumBounds::setNumSums(in_stack_fffffffffffffe80,numSums);
              HighsLinearSumBounds::setNumSums(in_stack_fffffffffffffe80,numSums);
              this_04 = &in_RDI->impliedRowBounds;
              __last._M_current =
                   (int *)std::vector<double,_std::allocator<double>_>::data
                                    ((vector<double,_std::allocator<double>_> *)0x6eb376);
              __first._M_current =
                   (int *)std::vector<double,_std::allocator<double>_>::data
                                    ((vector<double,_std::allocator<double>_> *)0x6eb392);
              __position._M_current =
                   (int *)std::vector<double,_std::allocator<double>_>::data
                                    ((vector<double,_std::allocator<double>_> *)0x6eb3ab);
              pdVar2 = std::vector<double,_std::allocator<double>_>::data
                                 ((vector<double,_std::allocator<double>_> *)0x6eb3c4);
              piVar3 = std::vector<int,_std::allocator<int>_>::data
                                 ((vector<int,_std::allocator<int>_> *)0x6eb3dd);
              implVarUpperSource =
                   std::vector<int,_std::allocator<int>_>::data
                             ((vector<int,_std::allocator<int>_> *)0x6eb3f6);
              HighsLinearSumBounds::setBoundArrays
                        (this_04,(double *)__last._M_current,(double *)__first._M_current,
                         (double *)__position._M_current,pdVar2,piVar3,implVarUpperSource);
              HighsLinearSumBounds::setNumSums
                        (in_stack_fffffffffffffe80,(HighsInt)((ulong)implVarUpperSource >> 0x20));
              this_00 = &in_RDI->impliedDualRowBounds;
              pdVar2 = std::vector<double,_std::allocator<double>_>::data
                                 ((vector<double,_std::allocator<double>_> *)0x6eb45c);
              varUpper = std::vector<double,_std::allocator<double>_>::data
                                   ((vector<double,_std::allocator<double>_> *)0x6eb478);
              implVarLower = std::vector<double,_std::allocator<double>_>::data
                                       ((vector<double,_std::allocator<double>_> *)0x6eb494);
              implVarUpper = std::vector<double,_std::allocator<double>_>::data
                                       ((vector<double,_std::allocator<double>_> *)0x6eb4b0);
              __x = (vector<double,_std::allocator<double>_> *)
                    std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x6eb4cc);
              this_01 = (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                         *)std::vector<int,_std::allocator<int>_>::data
                                     ((vector<int,_std::allocator<int>_> *)0x6eb4e8);
              HighsLinearSumBounds::setBoundArrays
                        (this_00,pdVar2,varUpper,implVarLower,implVarUpper,(HighsInt *)__x,
                         (HighsInt *)this_01);
              HighsLinearSumBounds::setNumSums
                        (in_stack_fffffffffffffe80,(HighsInt)((ulong)this_01 >> 0x20));
              sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
              sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)in_RDI,__x);
              bVar1 = okReserve<int>(in_stack_fffffffffffffe98,
                                     (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20));
              if (bVar1) {
                bVar1 = okReserve<int>(in_stack_fffffffffffffe98,
                                       (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20));
                if (bVar1) {
                  for (local_34 = 0; local_34 != (int)sVar4 + -1; local_34 = local_34 + 1) {
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (in_RCX,(long)(local_34 + 1));
                    vVar10 = *pvVar6;
                    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_34);
                    this_03 = &in_RDI->Acol;
                    std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)this_01);
                    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                    __normal_iterator<int*>
                              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)in_stack_fffffffffffffe80,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               this_01);
                    std::vector<int,_std::allocator<int>_>::insert
                              (this_03,in_stack_fffffffffffffeb8,
                               CONCAT44(vVar10,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0)
                    ;
                    in_stack_fffffffffffffeb8._M_current = (int *)&in_RDI->Arow;
                    std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)this_01);
                    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                    __normal_iterator<int*>
                              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)in_stack_fffffffffffffe80,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               this_01);
                    std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)this_01);
                    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_34);
                    __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
                    std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)this_01);
                    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_34 + 1));
                    __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffe88,(difference_type)in_stack_fffffffffffffe80);
                    std::vector<int,std::allocator<int>>::
                    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                              ((vector<int,_std::allocator<int>_> *)this_04,__position,__first,
                               __last);
                  }
                  bVar1 = okResize<int>(in_stack_fffffffffffffe98,
                                        (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                        (int)in_stack_fffffffffffffe90);
                  if (bVar1) {
                    bVar1 = okResize<int>(in_stack_fffffffffffffe98,
                                          (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                          (int)in_stack_fffffffffffffe90);
                    if (bVar1) {
                      bVar1 = okResize<int>(in_stack_fffffffffffffe98,
                                            (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                            (int)in_stack_fffffffffffffe90);
                      if (bVar1) {
                        bVar1 = okResize<int>(in_stack_fffffffffffffe98,
                                              (HighsInt)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                              (int)in_stack_fffffffffffffe90);
                        if (bVar1) {
                          __to = extraout_RDX;
                          for (local_8c = 0; local_8c != (uint)sVar5; local_8c = local_8c + 1) {
                            link(in_RDI,(char *)(ulong)local_8c,__to);
                            __to = extraout_RDX_00;
                          }
                          bVar1 = std::
                                  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                  ::empty((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                           *)0x6eb8aa);
                          if (bVar1) {
                            __args = &in_RDI->eqiters;
                            this_02 = (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                                       *)(long)in_RDI->model->num_row_;
                            std::
                            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                            ::end(this_01);
                            std::
                            vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                            ::assign((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                                      *)in_stack_fffffffffffffe80,(size_type)this_01,
                                     (value_type *)0x6eb900);
                            for (local_b4 = 0; local_b4 != in_RDI->model->num_row_;
                                local_b4 = local_b4 + 1) {
                              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                                 (&in_RDI->model->row_lower_,(long)local_b4);
                              piVar3 = (int *)*pvVar7;
                              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                                 (&in_RDI->model->row_upper_,(long)local_b4);
                              if (((double)piVar3 == *pvVar7) &&
                                 (!NAN((double)piVar3) && !NAN(*pvVar7))) {
                                std::vector<int,_std::allocator<int>_>::operator[]
                                          (&in_RDI->rowsize,(long)local_b4);
                                pVar9 = std::
                                        set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                                        ::emplace<int&,int&>(this_02,(int *)__args,piVar3);
                                pvVar8 = std::
                                         vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                                         ::operator[](&in_RDI->eqiters,(long)local_b4);
                                pvVar8->_M_node = pVar9.first._M_node._M_node;
                              }
                            }
                          }
                          local_1 = true;
                        }
                        else {
                          local_1 = false;
                        }
                      }
                      else {
                        local_1 = false;
                      }
                    }
                    else {
                      local_1 = false;
                    }
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HPresolve::okFromCSC(const std::vector<double>& Aval,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<HighsInt>& Astart) {
  Avalue.clear();
  Acol.clear();
  Arow.clear();

  freeslots.clear();
  if (!okAssign(colhead, model->num_col_, HighsInt{-1})) return false;
  if (!okAssign(rowroot, model->num_row_, HighsInt{-1})) return false;
  if (!okAssign(colsize, model->num_col_)) return false;
  if (!okAssign(rowsize, model->num_row_)) return false;
  if (!okAssign(rowsizeInteger, model->num_row_)) return false;
  if (!okAssign(rowsizeImplInt, model->num_row_)) return false;

  impliedRowBounds.setNumSums(0);
  impliedDualRowBounds.setNumSums(0);
  impliedRowBounds.setBoundArrays(
      model->col_lower_.data(), model->col_upper_.data(), implColLower.data(),
      implColUpper.data(), colLowerSource.data(), colUpperSource.data());
  impliedRowBounds.setNumSums(model->num_row_);
  impliedDualRowBounds.setBoundArrays(
      rowDualLower.data(), rowDualUpper.data(), implRowDualLower.data(),
      implRowDualUpper.data(), rowDualLowerSource.data(),
      rowDualUpperSource.data());
  impliedDualRowBounds.setNumSums(model->num_col_);

  HighsInt ncol = Astart.size() - 1;
  assert(ncol == int(colhead.size()));
  HighsInt nnz = Aval.size();

  Avalue = Aval;
  if (!okReserve(Acol, nnz)) return false;
  if (!okReserve(Arow, nnz)) return false;

  for (HighsInt i = 0; i != ncol; ++i) {
    HighsInt collen = Astart[i + 1] - Astart[i];
    Acol.insert(Acol.end(), collen, i);
    Arow.insert(Arow.end(), Aindex.begin() + Astart[i],
                Aindex.begin() + Astart[i + 1]);
  }

  if (!okResize(Anext, nnz)) return false;
  if (!okResize(Aprev, nnz)) return false;
  if (!okResize(ARleft, nnz)) return false;
  if (!okResize(ARright, nnz)) return false;
  for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);

  if (equations.empty()) {
    try {
      eqiters.assign(model->num_row_, equations.end());
    } catch (const std::bad_alloc& e) {
      printf("HPresolve::okFromCSC eqiters.assign fails with %s\n", e.what());
      return false;
    }
    for (HighsInt i = 0; i != model->num_row_; ++i) {
      // register equation
      if (model->row_lower_[i] == model->row_upper_[i])
        eqiters[i] = equations.emplace(rowsize[i], i).first;
    }
  }
  return true;
}